

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *args_4;
  PrimitiveInstantiationSyntax *pPVar1;
  DeepCloneVisitor visitor;
  SyntaxNode *local_58;
  Token local_50;
  Token local_40;
  SyntaxNode *local_30;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x60) == (SyntaxNode *)0x0) {
    local_58 = (SyntaxNode *)0x0;
  }
  else {
    local_58 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x60),(DeepCloneVisitor *)&local_50,
                          (BumpAllocator *)__child_stack);
  }
  if (*(SyntaxNode **)(__fn + 0x68) == (SyntaxNode *)0x0) {
    local_30 = (SyntaxNode *)0x0;
  }
  else {
    local_30 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x68),(DeepCloneVisitor *)&local_50,
                          (BumpAllocator *)__child_stack);
  }
  args_4 = deepClone<slang::syntax::HierarchicalInstanceSyntax>
                     ((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)
                      (__fn + 0x70),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0xa8),(BumpAllocator *)__child_stack);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::PrimitiveInstantiationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::NetStrengthSyntax*,slang::syntax::TimingControlSyntax*,slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_40,(NetStrengthSyntax **)&local_58,
                      (TimingControlSyntax **)&local_30,args_4,&local_50);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const PrimitiveInstantiationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<PrimitiveInstantiationSyntax>(
        *deepClone(node.attributes, alloc),
        node.type.deepClone(alloc),
        node.strength ? deepClone(*node.strength, alloc) : nullptr,
        node.delay ? deepClone(*node.delay, alloc) : nullptr,
        *deepClone(node.instances, alloc),
        node.semi.deepClone(alloc)
    );
}